

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<void_(pstore::gsl::span<int,_-1L>)>::Matches
          (OnCallSpec<void_(pstore::gsl::span<int,__1L>)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = MatcherBase<pstore::gsl::span<int,_-1L>_>::Matches
                    ((MatcherBase<pstore::gsl::span<int,__1L>_> *)(this + 0x10),
                     (span<int,__1L> *)args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<pstore::gsl::span<int,_-1L>_>_&>::Matches
                      ((MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&> *)
                       (this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }